

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader.cc
# Opt level: O1

void fizplex::MPSReader::parse_and_add_rhs
               (string *first_word,istringstream *iss,index_map *rows,LP *lp)

{
  int iVar1;
  RowType RVar2;
  pointer pcVar3;
  _Alloc_hider __nptr;
  const_iterator cVar4;
  long lVar5;
  int *piVar6;
  Row *pRVar7;
  size_t *psVar8;
  undefined8 uVar9;
  __hashtable *__h;
  bool bVar10;
  double upper;
  double dVar11;
  string row_name;
  string local_88;
  istringstream *local_68;
  string *local_60;
  string local_58;
  char *local_38;
  
  local_60 = first_word;
  cVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&rows->_M_h,first_word);
  bVar10 = cVar4.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
           ._M_cur == (__node_type *)0x0;
  local_68 = iss + 0x10;
  while( true ) {
    lVar5 = *(long *)(iss + 0x28) - *(long *)(iss + 0x20);
    if (lVar5 == 0) {
      lVar5 = (**(code **)(*(long *)local_68 + 0x38))();
    }
    if (lVar5 < 1) {
      return;
    }
    if (bVar10) {
      next_word(&local_88,iss);
    }
    else {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      pcVar3 = (local_60->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar3,pcVar3 + local_60->_M_string_length);
    }
    next_word(&local_58,iss);
    __nptr._M_p = local_58._M_dataplus._M_p;
    piVar6 = __errno_location();
    iVar1 = *piVar6;
    *piVar6 = 0;
    upper = strtod(__nptr._M_p,&local_38);
    if (local_38 == __nptr._M_p) goto LAB_00178332;
    if (*piVar6 == 0) {
      *piVar6 = iVar1;
    }
    else if (*piVar6 == 0x22) goto LAB_0017833e;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&rows->_M_h,&local_88);
    if (cVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) break;
    pRVar7 = LP::row_header(lp,*(size_t *)
                                ((long)cVar4.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28));
    RVar2 = pRVar7->type;
    dVar11 = upper;
    if (RVar2 == Equality) {
      cVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&rows->_M_h,&local_88);
      if (cVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) break;
      psVar8 = (size_t *)
               ((long)cVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                      ._M_cur + 0x28);
LAB_001782e2:
      LP::update_row_header(lp,*psVar8,pRVar7->type,dVar11,upper);
    }
    else {
      if (RVar2 == LE) {
        cVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&rows->_M_h,&local_88);
        if (cVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur != (__node_type *)0x0) {
          psVar8 = (size_t *)
                   ((long)cVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x28);
          dVar11 = pRVar7->lower;
          goto LAB_001782e2;
        }
        break;
      }
      if (RVar2 == GE) {
        cVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&rows->_M_h,&local_88);
        if (cVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur != (__node_type *)0x0) {
          psVar8 = (size_t *)
                   ((long)cVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x28);
          upper = pRVar7->upper;
          goto LAB_001782e2;
        }
        break;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    bVar10 = true;
  }
  std::__throw_out_of_range("_Map_base::at");
LAB_00178332:
  std::__throw_invalid_argument("stod");
LAB_0017833e:
  uVar9 = std::__throw_out_of_range("stod");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

void parse_and_add_rhs(const std::string &first_word, std::istringstream &iss,
                       const index_map &rows, LP &lp) {
  bool has_rhs_name = (rows.find(first_word) == rows.end());
  while (iss.rdbuf()->in_avail() > 0) {
    const auto row_name = has_rhs_name ? next_word(iss) : first_word;
    has_rhs_name = true;
    const auto rhs_value = std::stod(next_word(iss));
    const LP::Row &rh = lp.row_header(rows.at(row_name));
    switch (rh.type) {
    case RowType::LE:
      lp.update_row_header(rows.at(row_name), rh.type, rh.lower, rhs_value);
      break;
    case RowType::GE:
      lp.update_row_header(rows.at(row_name), rh.type, rhs_value, rh.upper);
      break;
    case RowType::Equality:
      lp.update_row_header(rows.at(row_name), rh.type, rhs_value, rhs_value);
      break;
    case RowType::NonBinding: // RHS irrelevant
      break;
    default:
      break;
    }
  }
}